

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector3f.cpp
# Opt level: O2

Vector3f __thiscall
Vector3f::cubicInterpolate
          (Vector3f *this,Vector3f *p0,Vector3f *p1,Vector3f *p2,Vector3f *p3,float t)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Vector3f VVar7;
  Vector3f p2p3;
  Vector3f p1p2;
  Vector3f p0p1;
  Vector3f local_80;
  Vector3f local_70;
  Vector3f local_60;
  Vector3f local_50;
  Vector3f local_40;
  
  lerp(&local_40,p0,p1,t + 1.0);
  lerp(&local_50,p1,p2,t);
  lerp(&local_60,p2,p3,t + -1.0);
  auVar6._8_8_ = 0;
  auVar6._0_4_ = local_50.m_elements[0];
  auVar6._4_4_ = local_50.m_elements[1];
  auVar5._8_8_ = 0;
  auVar5._0_4_ = local_40.m_elements[0];
  auVar5._4_4_ = local_40.m_elements[1];
  fVar1 = (t + 1.0) * 0.5;
  auVar3 = vsubps_avx(auVar6,auVar5);
  local_70.m_elements[2] =
       local_40.m_elements[2] + fVar1 * (local_50.m_elements[2] - local_40.m_elements[2]);
  auVar2._0_4_ = local_40.m_elements[0] + fVar1 * auVar3._0_4_;
  auVar2._4_4_ = local_40.m_elements[1] + fVar1 * auVar3._4_4_;
  auVar2._8_4_ = fVar1 * auVar3._8_4_ + 0.0;
  auVar2._12_4_ = fVar1 * auVar3._12_4_ + 0.0;
  local_70.m_elements._0_8_ = vmovlps_avx(auVar2);
  fVar1 = t * 0.5;
  local_80.m_elements[2] =
       local_50.m_elements[2] + fVar1 * (local_60.m_elements[2] - local_50.m_elements[2]);
  auVar3._8_8_ = 0;
  auVar3._0_4_ = local_60.m_elements[0];
  auVar3._4_4_ = local_60.m_elements[1];
  auVar3 = vsubps_avx(auVar3,auVar6);
  auVar4._0_4_ = local_50.m_elements[0] + fVar1 * auVar3._0_4_;
  auVar4._4_4_ = local_50.m_elements[1] + fVar1 * auVar3._4_4_;
  auVar4._8_4_ = fVar1 * auVar3._8_4_ + 0.0;
  auVar4._12_4_ = fVar1 * auVar3._12_4_ + 0.0;
  local_80.m_elements._0_8_ = vmovlps_avx(auVar4);
  VVar7 = lerp(this,&local_70,&local_80,t);
  return (Vector3f)VVar7.m_elements;
}

Assistant:

Vector3f Vector3f::cubicInterpolate( const Vector3f& p0, const Vector3f& p1, const Vector3f& p2, const Vector3f& p3, float t )
{
	// geometric construction:
	//            t
	//   (t+1)/2     t/2
	// t+1        t	        t-1

	// bottom level
	Vector3f p0p1 = Vector3f::lerp( p0, p1, t + 1 );
	Vector3f p1p2 = Vector3f::lerp( p1, p2, t );
	Vector3f p2p3 = Vector3f::lerp( p2, p3, t - 1 );

	// middle level
	Vector3f p0p1_p1p2 = Vector3f::lerp( p0p1, p1p2, 0.5f * ( t + 1 ) );
	Vector3f p1p2_p2p3 = Vector3f::lerp( p1p2, p2p3, 0.5f * t );

	// top level
	return Vector3f::lerp( p0p1_p1p2, p1p2_p2p3, t );
}